

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

logic_t slang::condWildcardEqual(SVInt *lhs,SVInt *rhs)

{
  ulong *puVar1;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 *paVar2;
  bool bVar3;
  uint uVar4;
  uint64_t *puVar5;
  SVInt *pSVar6;
  logic_t lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  SVInt SStack_28;
  
  if ((rhs->super_SVIntStorage).unknownFlag == false) {
    lVar7 = SVInt::operator==(lhs,rhs);
    return (logic_t)lVar7.value;
  }
  uVar4 = (lhs->super_SVIntStorage).bitWidth;
  uVar8 = (rhs->super_SVIntStorage).bitWidth;
  if (uVar4 == uVar8) {
    uVar8 = uVar4 + 0x3f >> 6;
    puVar5 = (rhs->super_SVIntStorage).field_0.pVal;
    bVar3 = (lhs->super_SVIntStorage).unknownFlag;
    pSVar6 = (SVInt *)(lhs->super_SVIntStorage).field_0.val;
    if ((bVar3 & 1U) != 0) {
      lhs = pSVar6;
    }
    if (0x40 < uVar4) {
      lhs = pSVar6;
    }
    uVar9 = (ulong)(uVar8 << 3);
    uVar10 = 0;
    do {
      if (uVar8 == uVar10) {
        return (logic_t)'\x01';
      }
      uVar11 = ~*(ulong *)((long)puVar5 + uVar10 * 8 + uVar9);
      if (((bVar3 & 1U) != 0) &&
         ((*(ulong *)((long)&(pSVar6->super_SVIntStorage).field_0 + uVar10 * 8 + uVar9) & uVar11) !=
          0)) {
        return (logic_t)0x80;
      }
      puVar1 = puVar5 + uVar10;
      paVar2 = &(lhs->super_SVIntStorage).field_0 + uVar10;
      uVar10 = uVar10 + 1;
    } while (((*puVar1 ^ paVar2->val) & uVar11) == 0);
    lVar7.value = '\0';
  }
  else {
    if (uVar4 < uVar8) {
      SVInt::extend(&SStack_28,(bitwidth_t)lhs,SUB41(uVar8,0));
      lVar7 = condWildcardEqual(&SStack_28,rhs);
    }
    else {
      SVInt::extend(&SStack_28,(bitwidth_t)rhs,SUB41(uVar4,0));
      lVar7 = condWildcardEqual(lhs,&SStack_28);
    }
    SVInt::~SVInt(&SStack_28);
  }
  return (logic_t)lVar7.value;
}

Assistant:

logic_t condWildcardEqual(const SVInt& lhs, const SVInt& rhs) {
    // if no unknown flags, do normal comparison
    if (!rhs.unknownFlag)
        return lhs == rhs;

    // handle sign extension if necessary
    if (lhs.bitWidth != rhs.bitWidth) {
        bool bothSigned = lhs.signFlag && rhs.signFlag;
        if (lhs.bitWidth < rhs.bitWidth)
            return condWildcardEqual(lhs.extend(rhs.bitWidth, bothSigned), rhs);
        else
            return condWildcardEqual(lhs, rhs.extend(lhs.bitWidth, bothSigned));
    }

    uint32_t words = SVInt::getNumWords(rhs.bitWidth, false);
    for (uint32_t i = 0; i < words; ++i) {
        // bitmask to avoid comparing the bits unknown on the rhs
        uint64_t mask = ~rhs.pVal[i + words];
        if (lhs.unknownFlag && (lhs.getRawData()[i + words] & mask) != 0)
            return logic_t::x;

        if ((lhs.getRawData()[i] & mask) != (rhs.pVal[i] & mask))
            return logic_t(false);
    }

    return logic_t(true);
}